

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O0

bool lua_zx_trdimage_add_file(char *trd,char *file,int start,int length,int autostart,bool replace)

{
  bool bVar1;
  bool local_6d;
  path local_58;
  byte local_2d;
  int local_2c;
  bool result;
  int positionsAdded;
  int iStack_20;
  bool replace_local;
  int autostart_local;
  int length_local;
  int start_local;
  char *file_local;
  char *trd_local;
  
  result = replace;
  positionsAdded = autostart;
  iStack_20 = length;
  autostart_local = start;
  _length_local = file;
  file_local = trd;
  local_2c = addLuaSourcePositions();
  bVar1 = false;
  local_6d = false;
  if ((file_local != (char *)0x0) && (local_6d = false, _length_local != (char *)0x0)) {
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_58,&file_local,auto_format);
    bVar1 = true;
    local_6d = TRD_AddFile(&local_58,_length_local,autostart_local,iStack_20,positionsAdded,
                           (bool)(result & 1),false,-1);
  }
  if (bVar1) {
    std::filesystem::__cxx11::path::~path(&local_58);
  }
  local_2d = local_6d;
  removeLuaSourcePositions(local_2c);
  return (bool)(local_2d & 1);
}

Assistant:

bool lua_zx_trdimage_add_file(const char* trd, const char* file, int start, int length, int autostart = -1, bool replace = false) {
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	bool result = nullptr != trd && nullptr != file && TRD_AddFile(trd, file, start, length, autostart, replace, false);
	removeLuaSourcePositions(positionsAdded);
	return result;
}